

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void Mips_printInst(MCInst *MI,SStream *O,void *info)

{
  uint uVar1;
  mips_reg Op;
  char *local_28;
  char *mnem;
  void *info_local;
  SStream *O_local;
  MCInst *MI_local;
  
  uVar1 = MCInst_getOpcode(MI);
  if ((1 < uVar1 - 0x547) && (1 < uVar1 - 0x641)) {
    local_28 = printAliasInstr(MI,O,info);
    if ((local_28 == (char *)0x0) && (local_28 = printAlias(MI,O), local_28 == (char *)0x0)) {
      printInstruction(MI,O,(MCRegisterInfo *)0x0);
    }
    if (local_28 != (char *)0x0) {
      Op = Mips_map_insn(local_28);
      MCInst_setOpcodePub(MI,Op);
      (*cs_mem_free)(local_28);
    }
  }
  return;
}

Assistant:

void Mips_printInst(MCInst *MI, SStream *O, void *info)
{
	char *mnem;

	switch (MCInst_getOpcode(MI)) {
		default: break;
		case Mips_Save16:
		case Mips_SaveX16:
		case Mips_Restore16:
		case Mips_RestoreX16:
			return;
	}

	// Try to print any aliases first.
	mnem = printAliasInstr(MI, O, info);
	if (!mnem) {
		mnem = printAlias(MI, O);
		if (!mnem) {
			printInstruction(MI, O, NULL);
		}
	}

	if (mnem) {
		// fixup instruction id due to the change in alias instruction
		MCInst_setOpcodePub(MI, Mips_map_insn(mnem));
		cs_mem_free(mnem);
	}
}